

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O0

void __thiscall
poplar::
map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_bonsai_nlm<int>_>::
expand_if_needed_(map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_bonsai_nlm<int>_>
                  *this,uint64_t *node_id)

{
  bool bVar1;
  node_map *this_00;
  plain_bonsai_nlm<int> *in_RSI;
  uint64_t in_RDI;
  node_map node_map;
  plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> *in_stack_00000138;
  plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> *in_stack_ffffffffffffff80;
  node_map *in_stack_ffffffffffffff90;
  node_map *in_stack_ffffffffffffffe8;
  
  bVar1 = plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::needs_to_expand
                    (in_stack_ffffffffffffff80);
  if (bVar1) {
    plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::expand(in_stack_00000138);
    this_00 = (node_map *)
              plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::node_map::operator[]
                        (in_stack_ffffffffffffff90,in_RDI);
    (in_RSI->ptrs_).
    super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)this_00;
    plain_bonsai_nlm<int>::
    expand<poplar::plain_bonsai_trie<90u,poplar::hash::vigna_hasher>::node_map>
              (in_RSI,in_stack_ffffffffffffffe8);
    plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::node_map::~node_map(this_00);
  }
  return;
}

Assistant:

void expand_if_needed_(uint64_t& node_id) {
        if constexpr (trie_type_id == trie_type_ids::BONSAI_TRIE) {
            if (!hash_trie_.needs_to_expand()) {
                return;
            }
            auto node_map = hash_trie_.expand();
            node_id = node_map[node_id];
            label_store_.expand(node_map);
        }
    }